

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_raw.c
# Opt level: O0

int archive_write_set_format_raw(archive *_a)

{
  long lVar1;
  int iVar2;
  undefined4 *puVar3;
  int magic_test;
  raw *raw;
  archive_write *a;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_raw");
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    lVar1._0_4_ = _a[2].magic;
    lVar1._4_4_ = _a[2].state;
    if (lVar1 != 0) {
      (**(code **)(_a + 2))(_a);
    }
    puVar3 = (undefined4 *)calloc(1,4);
    if (puVar3 == (undefined4 *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate raw data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      *puVar3 = 0;
      *(undefined4 **)&_a[1].current_codepage = puVar3;
      _a[1].sconv = (archive_string_conv *)0x846809;
      _a[1].read_data_offset = 0;
      _a[1].read_data_remaining = (size_t)archive_write_raw_header;
      *(code **)&_a[1].read_data_is_posix_read = archive_write_raw_data;
      _a[1].read_data_output_offset = 0;
      _a[1].read_data_requested = 0;
      *(code **)(_a + 2) = archive_write_raw_free;
      _a->archive_format = 0x90000;
      _a->archive_format_name = "RAW";
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_set_format_raw(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct raw *raw;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_raw");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	raw = (struct raw *)calloc(1, sizeof(*raw));
	if (raw == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate raw data");
		return (ARCHIVE_FATAL);
	}
	raw->entries_written = 0;
	a->format_data = raw;
	a->format_name = "raw";
        /* no options exist for this format */
	a->format_options = NULL;
	a->format_write_header = archive_write_raw_header;
	a->format_write_data = archive_write_raw_data;
	a->format_finish_entry = NULL;
        /* nothing needs to be done on closing */
	a->format_close = NULL;
	a->format_free = archive_write_raw_free;
	a->archive.archive_format = ARCHIVE_FORMAT_RAW;
	a->archive.archive_format_name = "RAW";
	return (ARCHIVE_OK);
}